

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall
Coverage_cellMl20ImportInPermissiveMode_Test::~Coverage_cellMl20ImportInPermissiveMode_Test
          (Coverage_cellMl20ImportInPermissiveMode_Test *this)

{
  Coverage_cellMl20ImportInPermissiveMode_Test *this_local;
  
  ~Coverage_cellMl20ImportInPermissiveMode_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Coverage, cellMl20ImportInPermissiveMode)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/component_importer.cellml"));
    auto importer = libcellml::Importer::create(false);

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());
}